

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  Table *pTVar1;
  int iVar2;
  Parse *in_RDI;
  long in_FS_OFFSET;
  Expr *pDfltExpr;
  int isInit;
  sqlite3 *db;
  Column *pCol;
  Table *p;
  Expr x;
  undefined7 in_stack_ffffffffffffff58;
  u8 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  Parse *in_stack_ffffffffffffff68;
  Expr *p_00;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar3;
  sqlite3 *pTab;
  Parse *pParse_00;
  undefined1 local_50 [4];
  undefined4 local_4c;
  char *local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pTab = in_RDI->db;
  pTVar1 = in_RDI->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    uVar3 = in_stack_ffffffffffffff64 & 0xffffff;
    if ((pTab->init).busy != '\0') {
      uVar3 = CONCAT13((pTab->init).iDb != '\x01',(int3)in_stack_ffffffffffffff64);
    }
    in_stack_ffffffffffffff64 = uVar3;
    uVar3 = in_stack_ffffffffffffff64 >> 0x18;
    pParse_00 = (Parse *)(pTVar1->aCol + (pTVar1->nCol + -1));
    iVar2 = sqlite3ExprIsConstantOrFunction
                      ((Expr *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5f);
    if (iVar2 == 0) {
      sqlite3ErrorMsg(in_RDI,"default value of column [%s] is not constant",pParse_00->db);
    }
    else if (((ulong)pParse_00->zErrMsg & 0x60000000000000) == 0) {
      memset(local_50,0xaa,0x48);
      p_00 = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
      memset(local_50,0,0x48);
      local_50[0] = 0xb5;
      local_48 = sqlite3DbSpanDup((sqlite3 *)CONCAT44(uVar3,in_stack_ffffffffffffff70),(char *)p_00,
                                  (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60));
      local_4c = 0x2000;
      in_stack_ffffffffffffff68 =
           (Parse *)sqlite3ExprDup((sqlite3 *)CONCAT44(uVar3,in_stack_ffffffffffffff70),p_00,
                                   in_stack_ffffffffffffff64);
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (void *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      sqlite3ColumnSetExpr
                (pParse_00,(Table *)pTab,(Column *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                 (Expr *)in_stack_ffffffffffffff68);
    }
    else {
      sqlite3ErrorMsg(in_RDI,"cannot use DEFAULT on a generated column");
    }
  }
  if (1 < in_RDI->eParseMode) {
    sqlite3RenameExprUnmap
              (in_stack_ffffffffffffff68,
               (Expr *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (Expr *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of default value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    int isInit = db->init.busy && db->init.iDb!=1;
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, isInit) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zCnName);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( pCol->colFlags & COLFLAG_GENERATED ){
      testcase( pCol->colFlags & COLFLAG_VIRTUAL );
      testcase( pCol->colFlags & COLFLAG_STORED );
      sqlite3ErrorMsg(pParse, "cannot use DEFAULT on a generated column");
#endif
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x, *pDfltExpr;
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pDfltExpr = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
      sqlite3ColumnSetExpr(pParse, p, pCol, pDfltExpr);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}